

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

undefined8 __thiscall FloatInstance::representation_abi_cxx11_(FloatInstance *this)

{
  int __n;
  _Setprecision _Var1;
  ostream *poVar2;
  Context *this_00;
  long in_RSI;
  undefined8 in_RDI;
  ostringstream oss;
  ostringstream local_188 [392];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_188,std::fixed);
  this_00 = Context::get_instance();
  __n = Context::get_float_precision(this_00);
  _Var1 = std::setprecision(__n);
  poVar2 = std::operator<<(poVar2,_Var1);
  std::ostream::operator<<(poVar2,*(float *)(in_RSI + 0x58));
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string FloatInstance::representation() const {
    std::ostringstream oss;
    oss << std::fixed << std::setprecision(Context::get_instance()->get_float_precision()) << _value;
    return oss.str();
}